

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_c_binding.cpp
# Opt level: O1

uint32_t __thiscall
basis_file::transcodeImage
          (basis_file *this,void *dst,uint32_t dst_size,uint32_t image_index,uint32_t level_index,
          uint32_t format,uint32_t param_6,uint32_t get_alpha_for_opaque_formats)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 in_register_00000084;
  transcoder_texture_format tVar7;
  basisu_transcoder_state *pbVar8;
  uint32_t orig_height;
  uint32_t orig_width;
  uint32_t total_blocks;
  void *local_48;
  basisu_transcoder *local_40;
  basisu_transcoder_state *local_38;
  
  if (this->m_magic != 0xdeadbee1) {
    __assert_fail("m_magic == MAGIC",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                  ,0xa0,
                  "uint32_t basis_file::transcodeImage(void *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  uVar3 = 0;
  if (format < 0x16) {
    local_40 = &this->m_transcoder;
    cVar1 = basist::basisu_transcoder::get_image_level_desc
                      (local_40,(uint)this->m_file,this->byteLength,image_index,
                       (uint *)CONCAT44(in_register_00000084,level_index),&orig_width,&orig_height);
    uVar3 = 0;
    if (cVar1 != '\0') {
      local_48 = dst;
      cVar1 = basist::basis_transcoder_format_is_uncompressed(format);
      if (cVar1 == '\0') {
        uVar5 = basist::basis_get_bytes_per_block_or_pixel(format);
        uVar3 = total_blocks * uVar5;
        if ((format & 0x1e) == 8) {
          uVar3 = orig_width + 3 & 0xfffffffc;
          uVar6 = orig_height + 3 & 0xfffffffc;
          if (uVar3 < 9) {
            uVar3 = 8;
          }
          if (uVar6 < 9) {
            uVar6 = 8;
          }
          uVar3 = uVar6 * uVar3 >> 1 & 0x1ffffff8;
          if (uVar3 < total_blocks * uVar5) {
            __assert_fail("required_size >= total_blocks * bytes_per_block",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                          ,0xd0,
                          "uint32_t basis_file::transcodeImage(void *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                         );
          }
        }
        if (dst_size < uVar3) {
          __assert_fail("required_size <= dst_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                        ,0xd3,
                        "uint32_t basis_file::transcodeImage(void *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                       );
        }
        uVar6 = (uint)this->m_file;
        uVar3 = this->byteLength;
        tVar7 = dst_size / uVar5;
        uVar5 = (uint)local_48;
        pbVar8 = (basisu_transcoder_state *)0x0;
      }
      else {
        iVar4 = basist::basis_get_uncompressed_bytes_per_pixel(format);
        pbVar8 = (basisu_transcoder_state *)(ulong)orig_width;
        tVar7 = orig_height * orig_width;
        local_38 = pbVar8;
        if (dst_size < iVar4 * tVar7) {
          __assert_fail("bytes_per_slice <= dst_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                        ,0xb7,
                        "uint32_t basis_file::transcodeImage(void *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                       );
        }
        uVar6 = (uint)this->m_file;
        uVar3 = this->byteLength;
        uVar5 = (uint)local_48;
      }
      bVar2 = basist::basisu_transcoder::transcode_image_level
                        (local_40,uVar6,uVar3,image_index,(void *)(ulong)level_index,uVar5,tVar7,
                         format,(uint)(get_alpha_for_opaque_formats != 0) << 2,pbVar8,0);
      uVar3 = (uint)bVar2;
    }
  }
  return uVar3;
}

Assistant:

uint32_t basis_file::transcodeImage(void* dst, uint32_t dst_size, uint32_t image_index, uint32_t level_index, uint32_t format, uint32_t /*pvrtc_wrap_addressing*/, uint32_t get_alpha_for_opaque_formats) {
    assert(m_magic == MAGIC);
    if (m_magic != MAGIC)
        return 0;

    if (format >= (uint32_t) basist::transcoder_texture_format::cTFTotalTextureFormats)
        return 0;

    const transcoder_texture_format transcoder_format = static_cast<transcoder_texture_format>(format);

    uint32_t orig_width, orig_height, total_blocks;
    if (!m_transcoder.get_image_level_desc(m_file, byteLength, image_index, level_index, orig_width, orig_height, total_blocks))
        return 0;

    uint32_t flags = get_alpha_for_opaque_formats ? cDecodeFlagsTranscodeAlphaDataToOpaqueFormats : 0;

    uint32_t status;

    if (basis_transcoder_format_is_uncompressed(transcoder_format))
    {
        MAYBE_UNUSED const uint32_t bytes_per_pixel = basis_get_uncompressed_bytes_per_pixel(transcoder_format);
        MAYBE_UNUSED const uint32_t bytes_per_line = orig_width * bytes_per_pixel;
        MAYBE_UNUSED const uint32_t bytes_per_slice = bytes_per_line * orig_height;

        assert(bytes_per_slice <= dst_size);

        status = m_transcoder.transcode_image_level(
            m_file, byteLength, image_index, level_index,
            dst, orig_width * orig_height,
            transcoder_format,
            flags,
            orig_width,
            nullptr,
            orig_height);
    }
    else
    {
        uint32_t bytes_per_block = basis_get_bytes_per_block_or_pixel(transcoder_format);

        MAYBE_UNUSED uint32_t required_size = total_blocks * bytes_per_block;

        if (transcoder_format == transcoder_texture_format::cTFPVRTC1_4_RGB || transcoder_format == transcoder_texture_format::cTFPVRTC1_4_RGBA)
        {
            // For PVRTC1, Basis only writes (or requires) total_blocks * bytes_per_block. But GL requires extra padding for very small textures: 
            // https://www.khronos.org/registry/OpenGL/extensions/IMG/IMG_texture_compression_pvrtc.txt
            // The transcoder will clear the extra bytes followed the used blocks to 0.
            const uint32_t width = (orig_width + 3) & ~3;
            const uint32_t height = (orig_height + 3) & ~3;
            required_size = (std::max(8U, width) * std::max(8U, height) * 4 + 7) / 8;
            assert(required_size >= total_blocks * bytes_per_block);
        }

        assert(required_size <= dst_size);

        status = m_transcoder.transcode_image_level(
            m_file, byteLength, image_index, level_index,
            dst, dst_size / bytes_per_block,
            static_cast<basist::transcoder_texture_format>(format),
            flags);
    }

    return status;
}